

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

void sptk::swipe::Slast(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps,
                       double nyquist,double nyquist2,double dt,int n)

{
  matrix L_00;
  matrix S_00;
  vector pci_00;
  vector mu_00;
  intvector ps_00;
  vector fERBs_00;
  int w2_00;
  int lo_00;
  undefined8 in_RSI;
  double *in_RDI;
  long in_R9;
  matrix mVar2;
  vector vVar3;
  vector vVar4;
  vector yr_vector;
  undefined8 in_stack_00000010;
  uint in_stack_00000018;
  long in_stack_00000020;
  undefined8 in_stack_00000038;
  double *in_stack_00000040;
  int in_stack_00000048;
  int in_stack_000000b0;
  int in_stack_000000b4;
  double in_stack_000000b8;
  undefined1 in_stack_000000c0 [16];
  vector in_stack_000000d0;
  int ti;
  vector pci;
  vector mu;
  int psz;
  int hi;
  int lo;
  matrix L;
  int w2;
  int i;
  undefined8 uVar5;
  double in_stack_fffffffffffffea8;
  double in_stack_fffffffffffffeb0;
  undefined4 in_stack_ffffffffffffff18;
  int iVar6;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  double *local_80;
  int local_6c;
  double **ppdVar1;
  
  mVar2 = loudness(in_stack_000000d0,(vector)in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                   in_stack_000000b0);
  yr_vector.v = mVar2.m;
  yr_vector._0_8_ = in_stack_00000020;
  local_6c = bisectv((swipe *)(ulong)in_stack_00000018,yr_vector,(double)in_stack_00000048);
  vVar3 = makev(0);
  w2_00 = vVar3.x;
  vVar4 = makev(0);
  ppdVar1 = (double **)vVar4.v;
  lo_00 = vVar4.x;
  iVar6 = 0;
  for (; local_6c < (int)in_stack_00000018; local_6c = local_6c + 1) {
    ppdVar1[iVar6] = *(double **)(in_R9 + (long)local_6c * 8);
    vVar3.v[iVar6] =
         (double)(1.0 - ABS(*(double *)(in_stack_00000020 + (long)local_6c * 8) -
                            (double)(in_stack_00000048 + 1)));
    iVar6 = iVar6 + 1;
  }
  local_80 = mVar2._0_8_;
  uVar5 = CONCAT44(uStack_dc,lo_00);
  L_00.y = uStack_cc;
  L_00.x = w2_00;
  fERBs_00.v = in_stack_00000040;
  fERBs_00._0_8_ = in_stack_00000038;
  S_00.m = ppdVar1;
  S_00.x = lo_00;
  S_00.y = uStack_dc;
  L_00.m = (double **)vVar3.v;
  pci_00.v = local_80;
  pci_00._0_8_ = in_stack_00000010;
  mu_00.v = in_RDI;
  mu_00._0_8_ = yr_vector.v;
  ps_00.v._0_4_ = in_stack_ffffffffffffff18;
  ps_00._0_8_ = in_RSI;
  ps_00.v._4_4_ = iVar6;
  Sadd(S_00,L_00,fERBs_00,pci_00,mu_00,ps_00,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
       lo_00,(int)vVar4.v,w2_00);
  mVar2.m = ppdVar1;
  mVar2.x = (int)uVar5;
  mVar2.y = (int)((ulong)uVar5 >> 0x20);
  freem(mVar2);
  vVar3.v = (double *)ppdVar1;
  vVar3._0_8_ = uVar5;
  freev(vVar3);
  vVar4.v = (double *)ppdVar1;
  vVar4._0_8_ = uVar5;
  freev(vVar4);
  return;
}

Assistant:

void Slast(matrix S, vector x, vector pc, vector fERBs, vector d, 
                                          intvector ws, intvector ps, 
                                          double nyquist, double nyquist2, 
                                          double dt, int n) {
    int i;
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = bisectv(d, n); // start of Slast-specific code
    int hi = d.x;
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    int ti = 0;
    for (i = lo; i < hi; i++) {
        pci.v[ti] = pc.v[i];
        mu.v[ti] = 1. - fabs(d.v[i] - (n + 1));
        ti++;
    } // end of Slast-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}